

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O3

void vocrevert(voccxdef *vctx)

{
  ushort uVar1;
  vocidef **ppvVar2;
  vocidef *pvVar3;
  mcmcxdef *pmVar4;
  mcmodef *pmVar5;
  vocidef **ppvVar6;
  int iVar7;
  ulong uVar8;
  objnum objn;
  ulong uVar9;
  vocidef ***pppvVar10;
  long lVar11;
  ulong local_40;
  
  local_40 = 0;
  iVar7 = 0;
  pppvVar10 = vctx->voccxinh;
  do {
    ppvVar2 = *pppvVar10;
    if (ppvVar2 != (vocidef **)0x0) {
      lVar11 = 0;
      uVar9 = local_40;
      do {
        pvVar3 = ppvVar2[lVar11];
        if (pvVar3 != (vocidef *)0x0) {
          objn = (objnum)uVar9;
          if (((pvVar3->vociu).vocius.vociusflg & 0x10) == 0) {
            pmVar4 = vctx->voccxmem;
            pmVar5 = pmVar4->mcmcxgl->mcmcxtab[pmVar4->mcmcxmtb[uVar9 >> 8 & 0xffffff][lVar11] >> 8]
            ;
            uVar8 = (ulong)((pmVar4->mcmcxmtb[uVar9 >> 8 & 0xffffff][lVar11] & 0xff) << 5);
            uVar1 = *(ushort *)((long)&pmVar5->mcmoflg + uVar8);
            if ((uVar1 & 8) == 0) {
              *(ushort *)((long)&pmVar5->mcmoflg + uVar8) = uVar1 | 0x100;
            }
            else {
              (*pmVar4->mcmcxrvf)(pmVar4->mcmcxrvc,objn);
            }
          }
          else {
            ppvVar6 = vctx->voccxinh[uVar9 >> 8 & 0xffffff];
            pvVar3 = ppvVar6[lVar11];
            ppvVar6[lVar11] = (vocidef *)0x0;
            if (pvVar3 != (vocidef *)0x0) {
              pvVar3->vociu = (anon_union_8_2_176b10ea_for_vociu)vctx->voccxifr;
              vctx->voccxifr = pvVar3;
            }
            vocdel1(vctx,objn,(char *)0x0,0,1,0,0);
            mcmfre(vctx->voccxmem,objn);
          }
        }
        uVar9 = uVar9 + 1;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x100);
    }
    pppvVar10 = pppvVar10 + 1;
    iVar7 = iVar7 + 1;
    local_40 = local_40 + 0x100;
  } while (iVar7 != 0x80);
  vocdel1(vctx,0xffff,(char *)0x0,0,1,1,0);
  return;
}

Assistant:

void vocrevert(voccxdef *vctx)
{
    vocidef ***vpg;
    vocidef  **v;
    int        i;
    int        j;
    objnum     obj;

    /*
     *   Go through the inheritance records.  Delete each dynamically
     *   allocated object, and revert each static object to its original
     *   load state. 
     */
    for (vpg = vctx->voccxinh, i = 0 ; i < VOCINHMAX ; ++vpg, ++i)
    {
        if (!*vpg) continue;
        for (v = *vpg, obj = (i << 8), j = 0 ; j < 256 ; ++v, ++obj, ++j)
        {
            if (*v)
            {
                /* if the object was dynamically allocated, delete it */
                if ((*v)->vociflg & VOCIFNEW)
                {
                    /* delete vocabulary and inheritance data for the object */
                    vocidel(vctx, obj);
                    vocdel(vctx, obj);

                    /* delete the object */
                    mcmfre(vctx->voccxmem, (mcmon)obj);
                }
                else
                {
                    /* revert the object */
                    mcmrevert(vctx->voccxmem, (mcmon)obj);
                }
            }
        }
    }

    /*
     *   Revert the vocabulary list: delete all newly added words, and
     *   undelete all original words marked as deleted.  
     */
    vocdel1(vctx, MCMONINV, (char *)0, 0, TRUE, TRUE, FALSE);
}